

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O2

void octaveInitBeta(OctaveNoise *noise,uint64_t *seed,PerlinNoise *octaves,int octcnt,double lac,
                   double lacMul,double persist,double persistMul)

{
  double *pdVar1;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 0;
  uVar2 = 0;
  if (0 < octcnt) {
    uVar2 = (ulong)(uint)octcnt;
  }
  for (; uVar2 * 0x140 - lVar3 != 0; lVar3 = lVar3 + 0x140) {
    perlinInit((PerlinNoise *)(octaves->d + lVar3),seed);
    pdVar1 = (double *)((long)&octaves->amplitude + lVar3);
    *pdVar1 = persist;
    pdVar1[1] = lac;
    persist = persist * persistMul;
    lac = lac * lacMul;
  }
  noise->octaves = octaves;
  noise->octcnt = octcnt;
  return;
}

Assistant:

void octaveInitBeta(OctaveNoise *noise, uint64_t *seed, PerlinNoise *octaves,
    int octcnt, double lac, double lacMul, double persist, double persistMul)
{
    int i;
    for (i = 0; i < octcnt; i++)
    {
        perlinInit(&octaves[i], seed);
        octaves[i].amplitude = persist;
        octaves[i].lacunarity = lac;
        persist *= persistMul;
        lac *= lacMul;
    }
    noise->octaves = octaves;
    noise->octcnt = octcnt;
}